

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O1

int Pdr_ObjRegNum(Pdr_Man_t *p,int k,int iSatVar)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int *piVar6;
  
  if (p->pPars->fMonoCnf == 0) {
    if ((k < 0) || ((p->vVar2Ids).nSize <= k)) {
LAB_00903476:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((iSatVar < 1) ||
       (pvVar3 = (p->vVar2Ids).pArray[(uint)k], *(int *)((long)pvVar3 + 4) <= iSatVar)) {
      __assert_fail("iSatVar > 0 && iSatVar < Vec_IntSize(vVar2Ids)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x122,"int Pdr_ObjRegNum2(Pdr_Man_t *, int, int)");
    }
    uVar1 = *(uint *)(*(long *)((long)pvVar3 + 8) + (ulong)(uint)iSatVar * 4);
    if ((ulong)uVar1 == 0xffffffff) {
      iVar5 = -1;
    }
    else {
      pVVar4 = p->pAig->vObjs;
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        piVar6 = (int *)0x0;
      }
      else {
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) goto LAB_00903476;
        piVar6 = (int *)pVVar4->pArray[uVar1];
      }
      if (((piVar6[6] & 7U) != 3) ||
         (iVar2 = p->pAig->nTruePos, iVar5 = *piVar6 - iVar2, *piVar6 < iVar2)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                      ,0x129,"int Pdr_ObjRegNum2(Pdr_Man_t *, int, int)");
      }
    }
  }
  else {
    if (iSatVar < 0) {
      __assert_fail("iSatVar >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                    ,0x108,"int Pdr_ObjRegNum1(Pdr_Man_t *, int, int)");
    }
    iVar5 = -1;
    if (iSatVar < p->pCnf1->nVars) {
      if (p->vVar2Reg->nSize <= iSatVar) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vVar2Reg->pArray[(uint)iSatVar];
      if ((iVar5 < 0) || (p->pAig->nRegs <= iVar5)) {
        __assert_fail("RegId >= 0 && RegId < Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                      ,0x10e,"int Pdr_ObjRegNum1(Pdr_Man_t *, int, int)");
      }
    }
  }
  return iVar5;
}

Assistant:

int Pdr_ObjRegNum( Pdr_Man_t * p, int k, int iSatVar )
{
    if ( p->pPars->fMonoCnf )
        return Pdr_ObjRegNum1( p, k, iSatVar );
    else
        return Pdr_ObjRegNum2( p, k, iSatVar );
}